

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wchar.cpp
# Opt level: O0

char16_t * PAL_wcsrchr(char16_t *string,char16_t c)

{
  char16_t *local_20;
  char16_t *last;
  char16_t *pcStack_10;
  char16_t c_local;
  char16_t *string_local;
  
  local_20 = (char16_t *)0x0;
  pcStack_10 = string;
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  for (; *pcStack_10 != L'\0'; pcStack_10 = pcStack_10 + 1) {
    if (*pcStack_10 == c) {
      local_20 = pcStack_10;
    }
  }
  if (!PAL_InitializeChakraCoreCalled) {
    abort();
  }
  return local_20;
}

Assistant:

char16_t _WConst_return *
__cdecl
PAL_wcsrchr(
        const char16_t * string,
        char16_t c)
{
    char16_t *last = NULL;

    PERF_ENTRY(wcsrchr);
    ENTRY("wcsrchr (string=%p (%S), c=%C)\n", string?string:W16_NULLSTRING, string?string:W16_NULLSTRING, c);

    while (*string)
    {
        if (*string == c)
        {
            last = (char16_t *) string;
        }
        string++;
    }

    LOGEXIT("wcsrchr returning char16_t %p (%S)\n", last?last:W16_NULLSTRING, last?last:W16_NULLSTRING);
    PERF_EXIT(wcsrchr);
    return (char16_t *)last;
}